

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_timeouts_test.cpp
# Opt level: O2

void __thiscall async_test::binder::operator()(binder *this,completion_type ct)

{
  callback *pcVar1;
  time_t tVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint i;
  callback<void_(cppcms::http::context::completion_type)> local_50;
  binder local_48;
  
  if (ct == operation_aborted) {
    async_bad_count = async_bad_count + 1;
    tVar2 = time((time_t *)0x0);
    poVar3 = std::operator<<((ostream *)&std::cout,"IO Completed in ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," seconds, timeout=");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->timeout);
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar6 = tVar2 - this->start;
    lVar4 = (long)this->timeout;
    if (lVar4 * 3 < lVar6) {
      above_3to = above_3to + 1;
    }
    else if (SBORROW8(lVar6,lVar4 * 2) != lVar6 + lVar4 * -2 < 0) {
      below_2to = below_2to + 1;
    }
  }
  else {
    if (this->counter < 1) {
      cppcms::http::context::async_complete_response();
      return;
    }
    this->counter = this->counter + -1;
    cppcms::http::context::response();
    uVar5 = cppcms::http::response::out();
    for (lVar4 = 0; lVar4 != 1000; lVar4 = lVar4 + 1) {
      poVar3 = std::ostream::_M_insert<unsigned_long>(uVar5);
      std::operator<<(poVar3,'\n');
    }
    pcVar1 = (callback *)
             (this->context).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    binder(&local_48,this);
    booster::callback<void_(cppcms::http::context::completion_type)>::callback<async_test::binder>
              (&local_50,&local_48);
    cppcms::http::context::async_flush_output(pcVar1);
    booster::intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_>::
    ~intrusive_ptr(&local_50.call_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.context.
                super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void operator()(cppcms::http::context::completion_type ct)
		{
			if(ct == cppcms::http::context::operation_aborted) {
				async_bad_count++;
				time_t end = time(0);
				std::cout << "IO Completed in " << (end-start) << " seconds, timeout=" << timeout << std::endl;
				if(end - start > 3*timeout)
					above_3to ++;
				else if(end - start < 2*timeout)
					below_2to ++;
				return;
			}
			if(counter > 0) {
				counter --;
				std::ostream &out = context->response().out();
				for(unsigned i=0;i<1000;i++) {
					out << i << '\n';
				}
				context->async_flush_output(*this);
			}
			else {
				context->async_complete_response();
			}
		}